

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  App *pAStack_1d0;
  int retCode;
  code *local_1c8;
  undefined8 local_1c0;
  thread local_1b8;
  thread logicThread;
  undefined1 local_1a0 [8];
  App app;
  MySimulator sim;
  char **argv_local;
  int argc_local;
  
  brown::MySimulator::MySimulator((MySimulator *)&app.keystatus);
  brown::App::App((App *)local_1a0,(Simulator *)&app.keystatus);
  local_1c8 = brown::App::runLogic;
  local_1c0 = 0;
  pAStack_1d0 = (App *)local_1a0;
  std::thread::thread<int(brown::App::*)(),brown::App*,void>
            (&local_1b8,(type *)&local_1c8,&stack0xfffffffffffffe30);
  iVar1 = brown::App::runGraphics((App *)local_1a0);
  std::thread::join();
  std::thread::~thread(&local_1b8);
  brown::App::~App((App *)local_1a0);
  brown::MySimulator::~MySimulator((MySimulator *)&app.keystatus);
  return iVar1;
}

Assistant:

int main(int argc, const char * argv[]) {
    brown::MySimulator sim;
    brown::App app(sim);
    std::thread logicThread(&brown::App::runLogic, &app);
    int retCode = app.runGraphics();
    logicThread.join();
    return retCode;
}